

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int mcpl2phits_app(int argc,char **argv)

{
  int iVar1;
  uint64_t *in_RSI;
  undefined4 in_EDI;
  char **unaff_retaddr;
  char **in_stack_00000008;
  int reclen;
  int parse;
  int nopolarisation;
  int use64bitreclen;
  uint64_t nparticles_limit;
  char *outphitsfile;
  char *inmcplfile;
  int in_stack_00000074;
  uint64_t in_stack_00000078;
  int in_stack_00000084;
  char *in_stack_00000088;
  char *in_stack_00000090;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mcpl2phits_parse_args
                    (reclen,in_stack_00000008,unaff_retaddr,
                     (char **)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_RSI,
                     in_stack_ffffffffffffffe8,(int *)nparticles_limit);
  if (iVar1 == -1) {
    iVar1 = 0;
  }
  else if (iVar1 == 0) {
    iVar1 = mcpl2phits(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000078,
                       in_stack_00000074);
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mcpl2phits_app( int argc, char** argv ) {

  const char * inmcplfile;
  const char * outphitsfile;
  uint64_t nparticles_limit;
  int use64bitreclen, nopolarisation;

  int parse = mcpl2phits_parse_args( argc, (const char**)argv, &inmcplfile,
                                     &outphitsfile, &nparticles_limit,
                                     &use64bitreclen, &nopolarisation);

  if (parse==-1)// --help
    return 0;

  if (parse)// parse error
    return parse;

  int reclen = (use64bitreclen?8:4);

  if ( mcpl2phits( inmcplfile, outphitsfile, (nopolarisation?0:1),
                   nparticles_limit, reclen) )
    return 0;

  return 1;
}